

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# package.cpp
# Opt level: O2

void __thiscall icu_63::Package::readPackage(Package *this,char *filename)

{
  int iVar1;
  uint8_t *data;
  FILE *__stream;
  ulong uVar2;
  char cVar3;
  int32_t iVar4;
  uint32_t uVar5;
  uint uVar6;
  uint8_t *puVar7;
  UDataSwapper *pUVar8;
  char *pcVar9;
  Item *pIVar10;
  byte bVar11;
  ulong uVar12;
  int32_t in_EDX;
  uint uVar13;
  uint uVar14;
  char *pcVar15;
  char *__format;
  long lVar16;
  size_t sVar17;
  size_t __n;
  long lVar18;
  int iVar19;
  long lVar20;
  size_t sStackY_e0;
  UErrorCode errorCode;
  uint local_c8;
  char type;
  UDataSwapper *local_c0;
  char *local_b8;
  int local_ac;
  long local_a8;
  uint32_t *local_a0;
  ulong local_98;
  int32_t *local_90;
  size_t local_88;
  char *local_80;
  char prefix [68];
  
  extractPackageName(filename,this->inPkgName,in_EDX);
  local_b8 = filename;
  puVar7 = readFile((char *)0x0,filename,&this->inLength,&type);
  this->inData = puVar7;
  iVar19 = this->inLength;
  errorCode = U_ZERO_ERROR;
  local_c8 = (uint)type;
  makeTypeProps(type,&this->inCharset,&this->inIsBigEndian);
  pUVar8 = udata_openSwapper_63(this->inIsBigEndian,this->inCharset,'\0','\0',&errorCode);
  __stream = _stderr;
  if (U_ZERO_ERROR < errorCode) {
    pcVar9 = u_errorName_63(errorCode);
    fprintf(__stream,"icupkg: udata_openSwapper(\"%s\") failed - %s\n",local_b8,pcVar9);
LAB_001ed932:
    exit(errorCode);
  }
  pUVar8->printError = printPackageError;
  iVar4 = 0x400;
  if (iVar19 < 0x400) {
    iVar4 = iVar19;
  }
  pUVar8->printErrorContext = _stderr;
  this->headerLength = iVar4;
  local_c0 = pUVar8;
  iVar4 = udata_swapDataHeader_63(pUVar8,this->inData,iVar4,this->header,&errorCode);
  pUVar8 = local_c0;
  this->headerLength = iVar4;
  if (U_ZERO_ERROR < errorCode) goto LAB_001ed932;
  puVar7 = this->inData;
  bVar11 = puVar7[0xd];
  if ((((puVar7[0xc] != 0x43) || (bVar11 != 0x6d)) || (bVar11 = 0x6d, puVar7[0xe] != 'n')) ||
     ((puVar7[0xf] != 'D' || (puVar7[0x10] != '\x01')))) {
    fprintf(_stderr,
            "icupkg: data format %02x.%02x.%02x.%02x (format version %02x) is not recognized as an ICU .dat package\n"
            ,(ulong)puVar7[0xc],(ulong)bVar11,(ulong)puVar7[0xe],(ulong)puVar7[0xf],
            (uint)puVar7[0x10]);
    iVar19 = 0x10;
    goto LAB_001ed8b1;
  }
  this->inIsBigEndian = puVar7[8];
  this->inCharset = puVar7[9];
  iVar19 = iVar19 - iVar4;
  if (3 < iVar19) {
    lVar18 = (long)iVar4;
    local_90 = (int32_t *)(puVar7 + lVar18);
    iVar4 = udata_readInt32_63(local_c0,*local_90);
    this->itemCount = iVar4;
    setItemCapacity(this,iVar4);
    iVar1 = this->itemCount;
    if ((long)iVar1 == 0) {
LAB_001ed52c:
      if (this->doAutoPrefix == '\0') {
LAB_001ed851:
        udata_closeSwapper_63(pUVar8);
        return;
      }
      pcVar9 = "icupkg: --auto_toc_prefix[_with_type] but the input package is empty\n";
      sStackY_e0 = 0x45;
LAB_001ed987:
      fwrite(pcVar9,sStackY_e0,1,_stderr);
      goto LAB_001ed8af;
    }
    if (iVar1 * 8 + 4 <= iVar19) {
      local_a0 = (uint32_t *)(puVar7 + lVar18 + 4);
      uVar5 = (*pUVar8->readUInt32)(local_a0[(long)iVar1 * 2 + -1]);
      if ((int)(uVar5 + 0x14) <= iVar19) {
        iVar1 = this->itemCount;
        if (iVar1 < 1) goto LAB_001ed52c;
        local_ac = iVar19;
        if (this->itemMax < iVar1) {
          fprintf(_stderr,"icupkg: too many items, maximum is %d\n");
        }
        else {
          local_98 = (ulong)(iVar1 * 8 + 4);
          uVar5 = (*pUVar8->readUInt32)(*(uint32_t *)(puVar7 + lVar18 + 8));
          uVar2 = local_98;
          pUVar8 = local_c0;
          iVar19 = uVar5 + iVar1 * -8;
          uVar6 = iVar19 - 4;
          uVar12 = (ulong)uVar6;
          uVar13 = iVar19 - 3;
          do {
            uVar14 = (int)uVar6 >> 0x1f & uVar6;
            if ((int)uVar12 < 1) break;
            uVar14 = uVar13 - 1;
            lVar16 = uVar12 + (ulong)(uint)(iVar1 * 8) + lVar18 + 3;
            uVar12 = uVar12 - 1;
            uVar13 = uVar14;
          } while (puVar7[lVar16] != '\0');
          local_a8 = lVar18;
          if ((int)(this->inStringTop + uVar14) < 0x186a1) {
            pcVar9 = this->inStrings + this->inStringTop;
            (*local_c0->swapInvChars)
                      (local_c0,(void *)((long)local_90 + local_98),uVar14,pcVar9,&errorCode);
            if (U_ZERO_ERROR < errorCode) {
              pcVar9 = "icupkg failed to swap the input .dat package item name strings\n";
              sStackY_e0 = 0x3f;
              goto LAB_001ed987;
            }
            this->inStringTop = this->inStringTop + uVar14;
            memset(this->items,0,(long)this->itemCount * 0x18);
            uVar5 = (*pUVar8->readUInt32)(*local_a0);
            pcVar15 = pcVar9 + (int)(uVar5 - (int)uVar2);
            local_80 = pcVar9;
            if (this->doAutoPrefix == '\0') {
              local_88 = strlen(this->inPkgName);
              iVar19 = (int)local_88;
              __n = (size_t)iVar19;
              memcpy(prefix,this,__n);
              sVar17 = strlen(pcVar15);
              lVar18 = local_a8;
              if ((((int)sVar17 < iVar19 + 2) || (iVar19 = bcmp(pcVar15,this,__n), iVar19 != 0)) ||
                 (cVar3 = '_', pcVar15[__n] != '_')) {
                cVar3 = '/';
              }
              prefix[__n] = cVar3;
              sVar17 = (size_t)((int)local_88 + 1);
LAB_001ed6ed:
              prefix[sVar17] = '\0';
              lVar16 = 0;
              lVar20 = 0;
              pUVar8 = local_c0;
              while( true ) {
                if (this->itemCount <= lVar20) break;
                uVar5 = (*pUVar8->readUInt32)(*(uint32_t *)(puVar7 + lVar20 * 8 + lVar18 + 4));
                pcVar9 = local_80 + (int)(uVar5 - (int)local_98);
                iVar19 = strncmp(pcVar9,prefix,sVar17);
                pUVar8 = local_c0;
                if ((iVar19 != 0) || (pcVar9[sVar17] == '\0')) {
                  __format = "icupkg: input .dat item name \"%s\" does not start with \"%s\"\n";
                  pcVar15 = prefix;
                  goto LAB_001ed8a8;
                }
                *(char **)((long)&this->items->name + lVar16) = pcVar9 + sVar17;
                uVar5 = (*local_c0->readUInt32)(*(uint32_t *)(puVar7 + lVar20 * 8 + lVar18 + 8));
                pIVar10 = this->items;
                *(ulong *)((long)&pIVar10->data + lVar16) = (ulong)uVar5 + (long)local_90;
                if (lVar16 != 0) {
                  data = *(uint8_t **)((long)pIVar10 + lVar16 + -0x10);
                  iVar19 = (int)((ulong)uVar5 + (long)local_90) - (int)data;
                  *(int *)((long)pIVar10 + lVar16 + -8) = iVar19;
                  uVar6 = getTypeEnumForInputData(data,iVar19,&errorCode);
                  if (((int)uVar6 < 0) || (U_ZERO_ERROR < errorCode)) {
                    pcVar9 = *(char **)((long)&this->items[-1].name + lVar16);
                    goto LAB_001ed89c;
                  }
                  pIVar10 = this->items;
                  *(char *)((long)pIVar10 + lVar16 + -3) = "lb?e"[uVar6];
                }
                (&pIVar10->isDataOwned)[lVar16] = '\0';
                lVar20 = lVar20 + 1;
                lVar16 = lVar16 + 0x18;
              }
              uVar5 = (*pUVar8->readUInt32)(local_a0[(long)this->itemCount * 2 + -1]);
              pIVar10 = this->items;
              iVar19 = this->itemCount;
              pIVar10[(long)iVar19 + -1].length = local_ac - uVar5;
              uVar6 = getTypeEnumForInputData
                                (pIVar10[(long)iVar19 + -1].data,local_ac - uVar5,&errorCode);
              if ((-1 < (int)uVar6) && (errorCode < U_ILLEGAL_ARGUMENT_ERROR)) {
                this->items[(long)this->itemCount + -1].type = "lb?e"[uVar6];
                if ((char)local_c8 != 'l') {
                  sortItems(this);
                }
                goto LAB_001ed851;
              }
              pcVar9 = this->items[(long)this->itemCount + -1].name;
LAB_001ed89c:
              __format = "icupkg: not an ICU data file: item \"%s\" in \"%s\"\n";
              pcVar15 = local_b8;
LAB_001ed8a8:
              fprintf(_stderr,__format,pcVar9,pcVar15);
            }
            else {
              pcVar9 = strchr(pcVar15,0x2f);
              lVar18 = local_a8;
              if (pcVar9 == (char *)0x0) {
                pcVar9 = 
                "icupkg: --auto_toc_prefix[_with_type] but the first entry \"%s\" does not contain a \'%c\'\n"
                ;
                uVar12 = 0x2f;
              }
              else {
                iVar19 = (int)((long)pcVar9 - (long)pcVar15);
                if ((iVar19 == 0) || (0x3f < iVar19)) {
                  fprintf(_stderr,
                          "icupkg: --auto_toc_prefix[_with_type] but the prefix of the first entry \"%s\" is empty or too long\n"
                         );
                  goto LAB_001ed8af;
                }
                lVar16 = (long)pcVar9 - (long)pcVar15 << 0x20;
                if ((this->prefixEndsWithType == '\0') ||
                   (pcVar15[lVar16 + -0x100000000 >> 0x20] == (char)local_c8)) {
                  sVar17 = lVar16 >> 0x20;
                  memcpy(this->pkgPrefix,pcVar15,sVar17);
                  this->pkgPrefix[sVar17] = '\0';
                  sVar17 = (size_t)(iVar19 + 1);
                  memcpy(prefix,pcVar15,sVar17);
                  goto LAB_001ed6ed;
                }
                pcVar9 = 
                "icupkg: --auto_toc_prefix_with_type but the prefix of the first entry \"%s\" does not end with \'%c\'\n"
                ;
                uVar12 = (ulong)local_c8;
              }
              fprintf(_stderr,pcVar9,pcVar15,uVar12);
            }
LAB_001ed8af:
            iVar19 = 3;
            goto LAB_001ed8b1;
          }
          fwrite("icupkg: total length of item name strings too long\n",0x33,1,_stderr);
        }
        iVar19 = 0xf;
        goto LAB_001ed8b1;
      }
    }
  }
  fprintf(_stderr,"icupkg: too few bytes (%ld after header) for a .dat package\n",(long)iVar19);
  iVar19 = 8;
LAB_001ed8b1:
  exit(iVar19);
}

Assistant:

void
Package::readPackage(const char *filename) {
    UDataSwapper *ds;
    const UDataInfo *pInfo;
    UErrorCode errorCode;

    const uint8_t *inBytes;

    int32_t length, offset, i;
    int32_t itemLength, typeEnum;
    char type;

    const UDataOffsetTOCEntry *inEntries;

    extractPackageName(filename, inPkgName, (int32_t)sizeof(inPkgName));

    /* read the file */
    inData=readFile(NULL, filename, inLength, type);
    length=inLength;

    /*
     * swap the header - even if the swapping itself is a no-op
     * because it tells us the header length
     */
    errorCode=U_ZERO_ERROR;
    makeTypeProps(type, inCharset, inIsBigEndian);
    ds=udata_openSwapper(inIsBigEndian, inCharset, U_IS_BIG_ENDIAN, U_CHARSET_FAMILY, &errorCode);
    if(U_FAILURE(errorCode)) {
        fprintf(stderr, "icupkg: udata_openSwapper(\"%s\") failed - %s\n",
                filename, u_errorName(errorCode));
        exit(errorCode);
    }

    ds->printError=printPackageError;
    ds->printErrorContext=stderr;

    headerLength=sizeof(header);
    if(length<headerLength) {
        headerLength=length;
    }
    headerLength=udata_swapDataHeader(ds, inData, headerLength, header, &errorCode);
    if(U_FAILURE(errorCode)) {
        exit(errorCode);
    }

    /* check data format and format version */
    pInfo=(const UDataInfo *)((const char *)inData+4);
    if(!(
        pInfo->dataFormat[0]==0x43 &&   /* dataFormat="CmnD" */
        pInfo->dataFormat[1]==0x6d &&
        pInfo->dataFormat[2]==0x6e &&
        pInfo->dataFormat[3]==0x44 &&
        pInfo->formatVersion[0]==1
    )) {
        fprintf(stderr, "icupkg: data format %02x.%02x.%02x.%02x (format version %02x) is not recognized as an ICU .dat package\n",
                pInfo->dataFormat[0], pInfo->dataFormat[1],
                pInfo->dataFormat[2], pInfo->dataFormat[3],
                pInfo->formatVersion[0]);
        exit(U_UNSUPPORTED_ERROR);
    }
    inIsBigEndian=(UBool)pInfo->isBigEndian;
    inCharset=pInfo->charsetFamily;

    inBytes=(const uint8_t *)inData+headerLength;
    inEntries=(const UDataOffsetTOCEntry *)(inBytes+4);

    /* check that the itemCount fits, then the ToC table, then at least the header of the last item */
    length-=headerLength;
    if(length<4) {
        /* itemCount does not fit */
        offset=0x7fffffff;
    } else {
        itemCount=udata_readInt32(ds, *(const int32_t *)inBytes);
        setItemCapacity(itemCount); /* resize so there's space */
        if(itemCount==0) {
            offset=4;
        } else if(length<(4+8*itemCount)) {
            /* ToC table does not fit */
            offset=0x7fffffff;
        } else {
            /* offset of the last item plus at least 20 bytes for its header */
            offset=20+(int32_t)ds->readUInt32(inEntries[itemCount-1].dataOffset);
        }
    }
    if(length<offset) {
        fprintf(stderr, "icupkg: too few bytes (%ld after header) for a .dat package\n",
                        (long)length);
        exit(U_INDEX_OUTOFBOUNDS_ERROR);
    }
    /* do not modify the package length variable until the last item's length is set */

    if(itemCount<=0) {
        if(doAutoPrefix) {
            fprintf(stderr, "icupkg: --auto_toc_prefix[_with_type] but the input package is empty\n");
            exit(U_INVALID_FORMAT_ERROR);
        }
    } else {
        char prefix[MAX_PKG_NAME_LENGTH+4];
        char *s, *inItemStrings;

        if(itemCount>itemMax) {
            fprintf(stderr, "icupkg: too many items, maximum is %d\n", itemMax);
            exit(U_BUFFER_OVERFLOW_ERROR);
        }

        /* swap the item name strings */
        int32_t stringsOffset=4+8*itemCount;
        itemLength=(int32_t)(ds->readUInt32(inEntries[0].dataOffset))-stringsOffset;

        // don't include padding bytes at the end of the item names
        while(itemLength>0 && inBytes[stringsOffset+itemLength-1]!=0) {
            --itemLength;
        }

        if((inStringTop+itemLength)>STRING_STORE_SIZE) {
            fprintf(stderr, "icupkg: total length of item name strings too long\n");
            exit(U_BUFFER_OVERFLOW_ERROR);
        }

        inItemStrings=inStrings+inStringTop;
        ds->swapInvChars(ds, inBytes+stringsOffset, itemLength, inItemStrings, &errorCode);
        if(U_FAILURE(errorCode)) {
            fprintf(stderr, "icupkg failed to swap the input .dat package item name strings\n");
            exit(U_INVALID_FORMAT_ERROR);
        }
        inStringTop+=itemLength;

        // reset the Item entries
        memset(items, 0, itemCount*sizeof(Item));

        /*
         * Get the common prefix of the items.
         * New-style ICU .dat packages use tree separators ('/') between package names,
         * tree names, and item names,
         * while old-style ICU .dat packages (before multi-tree support)
         * use an underscore ('_') between package and item names.
         */
        offset=(int32_t)ds->readUInt32(inEntries[0].nameOffset)-stringsOffset;
        s=inItemStrings+offset;  // name of the first entry
        int32_t prefixLength;
        if(doAutoPrefix) {
            // Use the first entry's prefix. Must be a new-style package.
            const char *prefixLimit=strchr(s, U_TREE_ENTRY_SEP_CHAR);
            if(prefixLimit==NULL) {
                fprintf(stderr,
                        "icupkg: --auto_toc_prefix[_with_type] but "
                        "the first entry \"%s\" does not contain a '%c'\n",
                        s, U_TREE_ENTRY_SEP_CHAR);
                exit(U_INVALID_FORMAT_ERROR);
            }
            prefixLength=(int32_t)(prefixLimit-s);
            if(prefixLength==0 || prefixLength>=UPRV_LENGTHOF(pkgPrefix)) {
                fprintf(stderr,
                        "icupkg: --auto_toc_prefix[_with_type] but "
                        "the prefix of the first entry \"%s\" is empty or too long\n",
                        s);
                exit(U_INVALID_FORMAT_ERROR);
            }
            if(prefixEndsWithType && s[prefixLength-1]!=type) {
                fprintf(stderr,
                        "icupkg: --auto_toc_prefix_with_type but "
                        "the prefix of the first entry \"%s\" does not end with '%c'\n",
                        s, type);
                exit(U_INVALID_FORMAT_ERROR);
            }
            memcpy(pkgPrefix, s, prefixLength);
            pkgPrefix[prefixLength]=0;
            memcpy(prefix, s, ++prefixLength);  // include the /
        } else {
            // Use the package basename as prefix.
            int32_t inPkgNameLength= static_cast<int32_t>(strlen(inPkgName));
            memcpy(prefix, inPkgName, inPkgNameLength);
            prefixLength=inPkgNameLength;

            if( (int32_t)strlen(s)>=(inPkgNameLength+2) &&
                0==memcmp(s, inPkgName, inPkgNameLength) &&
                s[inPkgNameLength]=='_'
            ) {
                // old-style .dat package
                prefix[prefixLength++]='_';
            } else {
                // new-style .dat package
                prefix[prefixLength++]=U_TREE_ENTRY_SEP_CHAR;
                // if it turns out to not contain U_TREE_ENTRY_SEP_CHAR
                // then the test in the loop below will fail
            }
        }
        prefix[prefixLength]=0;

        /* read the ToC table */
        for(i=0; i<itemCount; ++i) {
            // skip the package part of the item name, error if it does not match the actual package name
            // or if nothing follows the package name
            offset=(int32_t)ds->readUInt32(inEntries[i].nameOffset)-stringsOffset;
            s=inItemStrings+offset;
            if(0!=strncmp(s, prefix, prefixLength) || s[prefixLength]==0) {
                fprintf(stderr, "icupkg: input .dat item name \"%s\" does not start with \"%s\"\n",
                        s, prefix);
                exit(U_INVALID_FORMAT_ERROR);
            }
            items[i].name=s+prefixLength;

            // set the item's data
            items[i].data=(uint8_t *)inBytes+ds->readUInt32(inEntries[i].dataOffset);
            if(i>0) {
                items[i-1].length=(int32_t)(items[i].data-items[i-1].data);

                // set the previous item's platform type
                typeEnum=getTypeEnumForInputData(items[i-1].data, items[i-1].length, &errorCode);
                if(typeEnum<0 || U_FAILURE(errorCode)) {
                    fprintf(stderr, "icupkg: not an ICU data file: item \"%s\" in \"%s\"\n", items[i-1].name, filename);
                    exit(U_INVALID_FORMAT_ERROR);
                }
                items[i-1].type=makeTypeLetter(typeEnum);
            }
            items[i].isDataOwned=FALSE;
        }
        // set the last item's length
        items[itemCount-1].length=length-ds->readUInt32(inEntries[itemCount-1].dataOffset);

        // set the last item's platform type
        typeEnum=getTypeEnumForInputData(items[itemCount-1].data, items[itemCount-1].length, &errorCode);
        if(typeEnum<0 || U_FAILURE(errorCode)) {
            fprintf(stderr, "icupkg: not an ICU data file: item \"%s\" in \"%s\"\n", items[itemCount-1].name, filename);
            exit(U_INVALID_FORMAT_ERROR);
        }
        items[itemCount-1].type=makeTypeLetter(typeEnum);

        if(type!=U_ICUDATA_TYPE_LETTER[0]) {
            // sort the item names for the local charset
            sortItems();
        }
    }

    udata_closeSwapper(ds);
}